

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::FBXConverter::TrySetTextureProperties
          (FBXConverter *this,aiMaterial *out_mat,LayeredTextureMap *layeredTextures,
          string *propName,aiTextureType target,MeshGeometry *mesh)

{
  long lVar1;
  long lVar2;
  Texture *tex;
  PropertyTable *this_00;
  pointer ppaVar3;
  aiTextureType type;
  int iVar4;
  Property *pPVar5;
  long lVar6;
  __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_> _Var7;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar8;
  long *plVar9;
  MeshGeometry *this_01;
  MatIndexArray *pMVar10;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var11;
  _Rb_tree_node_base *p_Var12;
  undefined8 *puVar13;
  size_type *psVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  bool bVar19;
  bool bVar20;
  int uvIndex;
  uint matIndex;
  aiUVTransform uvTrafo;
  int blendmode;
  aiString path;
  uint local_66c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  aiMaterial *local_628;
  aiTextureType local_61c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  FBXConverter *local_5f8;
  ulong local_5f0;
  MeshGeometry *local_5e8;
  undefined4 local_5dc;
  _Rb_tree_node_base *local_5d8;
  _Base_ptr local_5d0;
  aiVector2D local_5c8;
  aiVector2D aStack_5c0;
  undefined4 local_5b8;
  undefined4 local_5b4;
  string local_5b0 [3];
  ios_base local_540 [268];
  aiString local_434;
  
  local_628 = out_mat;
  local_5f8 = this;
  local_5e8 = mesh;
  local_5d0 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>_>
              ::find(&layeredTextures->_M_t,propName);
  if ((_Rb_tree_header *)local_5d0 != &(layeredTextures->_M_t)._M_impl.super__Rb_tree_header) {
    lVar6 = *(long *)(local_5d0 + 2);
    lVar1 = *(long *)(lVar6 + 0x40);
    lVar2 = *(long *)(lVar6 + 0x38);
    local_5b4 = *(undefined4 *)(lVar6 + 0x50);
    local_61c = target;
    aiMaterial::AddBinaryProperty(local_628,&local_5b4,4,"$tex.op",target,0,aiPTI_Integer);
    uVar16 = (uint)((ulong)(lVar1 - lVar2) >> 3);
    if (0 < (int)uVar16) {
      local_5d8 = &(local_5f8->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_5f0 = (ulong)(uVar16 & 0x7fffffff);
      uVar17 = 0;
      do {
        tex = *(Texture **)(*(long *)(*(long *)(local_5d0 + 2) + 0x38) + uVar17 * 8);
        GetTexturePath(&local_434,local_5f8,tex);
        type = local_61c;
        uVar16 = (uint)uVar17;
        aiMaterial::AddProperty(local_628,&local_434,"$tex.file",local_61c,uVar16);
        local_5b8 = 0;
        aStack_5c0 = tex->uvScaling;
        local_5c8 = tex->uvTrans;
        aiMaterial::AddBinaryProperty
                  (local_628,&local_5c8,0x14,"$tex.uvtrafo",type,uVar16,aiPTI_Float);
        this_00 = (tex->props).
                  super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        if (this_00 == (PropertyTable *)0x0) {
          __assert_fail("props.get()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXDocument.h"
                        ,0x1f7,"const PropertyTable &Assimp::FBX::Texture::Props() const");
        }
        local_66c = 0;
        local_5b0[0]._M_dataplus._M_p = (pointer)&local_5b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"UVSet","");
        pPVar5 = PropertyTable::Get(this_00,local_5b0);
        if ((pPVar5 == (Property *)0x0) ||
           (lVar6 = __dynamic_cast(pPVar5,&Property::typeinfo,
                                   &TypedProperty<std::__cxx11::string>::typeinfo,0), lVar6 == 0)) {
          local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
          local_618._M_string_length = 0;
          local_618.field_2._M_local_buf[0] = '\0';
          bVar20 = false;
        }
        else {
          local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
          bVar20 = true;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_618,*(long *)(lVar6 + 8),
                     *(long *)(lVar6 + 0x10) + *(long *)(lVar6 + 8));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0[0]._M_dataplus._M_p != &local_5b0[0].field_2) {
          operator_delete(local_5b0[0]._M_dataplus._M_p,
                          local_5b0[0].field_2._M_allocated_capacity + 1);
        }
        if (((bVar20) && (iVar4 = std::__cxx11::string::compare((char *)&local_618), iVar4 != 0)) &&
           (local_618._M_string_length != 0)) {
          ppaVar3 = (local_5f8->materials).
                    super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          _Var7 = std::
                  __find_if<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,__gnu_cxx::__ops::_Iter_equals_val<aiMaterial*const>>
                            (ppaVar3,(local_5f8->materials).
                                     super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,&local_628);
          local_5dc = (undefined4)((ulong)((long)_Var7._M_current - (long)ppaVar3) >> 3);
          local_66c = 0xffffffff;
          if (local_5e8 == (MeshGeometry *)0x0) {
            p_Var12 = (local_5f8->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_left;
            if (p_Var12 != local_5d8) {
              do {
                if (*(long *)(p_Var12 + 1) == 0) {
                  this_01 = (MeshGeometry *)0x0;
                }
                else {
                  this_01 = (MeshGeometry *)
                            __dynamic_cast(*(long *)(p_Var12 + 1),&Geometry::typeinfo,
                                           &MeshGeometry::typeinfo,0);
                }
                uVar18 = local_66c;
                if (this_01 != (MeshGeometry *)0x0) {
                  pMVar10 = MeshGeometry::GetMaterialIndices(this_01);
                  _Var11 = std::
                           __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                     ((pMVar10->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (pMVar10->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_finish,&local_5dc);
                  uVar18 = local_66c;
                  if (_Var11._M_current !=
                      (pMVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
                    uVar18 = 0xffffffff;
                    uVar15 = 0;
                    do {
                      pvVar8 = MeshGeometry::GetTextureCoords(this_01,uVar15);
                      if ((pvVar8->
                          super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start ==
                          (pvVar8->
                          super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish) break;
                      MeshGeometry::GetTextureCoordChannelName_abi_cxx11_(local_5b0,this_01,uVar15);
                      if (local_5b0[0]._M_string_length == local_618._M_string_length) {
                        if (local_5b0[0]._M_string_length == 0) {
                          bVar20 = true;
                        }
                        else {
                          iVar4 = bcmp(local_5b0[0]._M_dataplus._M_p,local_618._M_dataplus._M_p,
                                       local_5b0[0]._M_string_length);
                          bVar20 = iVar4 == 0;
                        }
                      }
                      else {
                        bVar20 = false;
                      }
                      if (bVar20) {
                        uVar18 = uVar15;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_5b0[0]._M_dataplus._M_p != &local_5b0[0].field_2) {
                        operator_delete(local_5b0[0]._M_dataplus._M_p,
                                        local_5b0[0].field_2._M_allocated_capacity + 1);
                      }
                      bVar19 = 6 < uVar15;
                      uVar15 = uVar15 + 1;
                    } while (!(bool)(bVar19 | bVar20));
                    if (uVar18 == 0xffffffff) {
                      std::operator+(&local_648,"did not find UV channel named ",&local_618);
                      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_648);
                      local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
                      psVar14 = puVar13 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar13 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar14) {
                        local_668.field_2._M_allocated_capacity = *psVar14;
                        local_668.field_2._8_8_ = puVar13[3];
                      }
                      else {
                        local_668.field_2._M_allocated_capacity = *psVar14;
                        local_668._M_dataplus._M_p = (pointer)*puVar13;
                      }
                      local_668._M_string_length = puVar13[1];
                      *puVar13 = psVar14;
                      puVar13[1] = 0;
                      *(undefined1 *)(puVar13 + 2) = 0;
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      basic_formatter<std::__cxx11::string>
                                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                  *)local_5b0,&local_668);
                      LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
                    }
                    else {
                      if (local_66c == 0xffffffff) goto LAB_005bca10;
                      std::operator+(&local_648,"the UV channel named ",&local_618);
                      plVar9 = (long *)std::__cxx11::string::append((char *)&local_648);
                      local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
                      psVar14 = (size_type *)(plVar9 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar9 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar14) {
                        local_668.field_2._M_allocated_capacity = *psVar14;
                        local_668.field_2._8_8_ = plVar9[3];
                      }
                      else {
                        local_668.field_2._M_allocated_capacity = *psVar14;
                        local_668._M_dataplus._M_p = (pointer)*plVar9;
                      }
                      local_668._M_string_length = plVar9[1];
                      *plVar9 = (long)psVar14;
                      plVar9[1] = 0;
                      *(undefined1 *)(plVar9 + 2) = 0;
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      basic_formatter<std::__cxx11::string>
                                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                  *)local_5b0,&local_668);
                      LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
                    std::ios_base::~ios_base(local_540);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_668._M_dataplus._M_p != &local_668.field_2) {
                      operator_delete(local_668._M_dataplus._M_p,
                                      local_668.field_2._M_allocated_capacity + 1);
                    }
                    uVar18 = local_66c;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_648._M_dataplus._M_p != &local_648.field_2) {
                      operator_delete(local_648._M_dataplus._M_p,
                                      local_648.field_2._M_allocated_capacity + 1);
                      uVar18 = local_66c;
                    }
                  }
                }
LAB_005bca10:
                local_66c = uVar18;
                p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
              } while (p_Var12 != local_5d8);
            }
          }
          else {
            uVar15 = 0xffffffff;
            uVar18 = 0;
            do {
              pvVar8 = MeshGeometry::GetTextureCoords(local_5e8,uVar18);
              if ((pvVar8->
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start ==
                  (pvVar8->
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish) break;
              MeshGeometry::GetTextureCoordChannelName_abi_cxx11_(local_5b0,local_5e8,uVar18);
              if (local_5b0[0]._M_string_length == local_618._M_string_length) {
                if (local_5b0[0]._M_string_length == 0) {
                  bVar20 = true;
                }
                else {
                  iVar4 = bcmp(local_5b0[0]._M_dataplus._M_p,local_618._M_dataplus._M_p,
                               local_5b0[0]._M_string_length);
                  bVar20 = iVar4 == 0;
                }
              }
              else {
                bVar20 = false;
              }
              if (bVar20) {
                uVar15 = uVar18;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5b0[0]._M_dataplus._M_p != &local_5b0[0].field_2) {
                operator_delete(local_5b0[0]._M_dataplus._M_p,
                                local_5b0[0].field_2._M_allocated_capacity + 1);
              }
              bVar19 = uVar18 < 7;
              uVar18 = uVar18 + 1;
            } while (bVar19 && !bVar20);
            if (uVar15 == 0xffffffff) {
              std::operator+(&local_648,"did not find UV channel named ",&local_618);
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_648);
              psVar14 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar14) {
                local_668.field_2._M_allocated_capacity = *psVar14;
                local_668.field_2._8_8_ = plVar9[3];
                local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
              }
              else {
                local_668.field_2._M_allocated_capacity = *psVar14;
                local_668._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_668._M_string_length = plVar9[1];
              *plVar9 = (long)psVar14;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              basic_formatter<std::__cxx11::string>
                        ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         local_5b0,&local_668);
              LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
              std::ios_base::~ios_base(local_540);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_668._M_dataplus._M_p != &local_668.field_2) {
                operator_delete(local_668._M_dataplus._M_p,
                                local_668.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_648._M_dataplus._M_p != &local_648.field_2) {
                operator_delete(local_648._M_dataplus._M_p,
                                local_648.field_2._M_allocated_capacity + 1);
              }
            }
            if (local_66c == 0xffffffff) {
              local_66c = uVar15;
            }
          }
          if (local_66c == 0xffffffff) {
            std::operator+(&local_648,"failed to resolve UV channel ",&local_618);
            puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_648);
            psVar14 = puVar13 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar13 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar14) {
              local_668.field_2._M_allocated_capacity = *psVar14;
              local_668.field_2._8_8_ = puVar13[3];
              local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
            }
            else {
              local_668.field_2._M_allocated_capacity = *psVar14;
              local_668._M_dataplus._M_p = (pointer)*puVar13;
            }
            local_668._M_string_length = puVar13[1];
            *puVar13 = psVar14;
            puVar13[1] = 0;
            *(undefined1 *)(puVar13 + 2) = 0;
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
            basic_formatter<std::__cxx11::string>
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       local_5b0,&local_668);
            LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
            std::ios_base::~ios_base(local_540);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_668._M_dataplus._M_p != &local_668.field_2) {
              operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_648._M_dataplus._M_p != &local_648.field_2) {
              operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1
                             );
            }
            local_66c = 0;
          }
        }
        aiMaterial::AddBinaryProperty
                  (local_628,&local_66c,4,"$tex.uvwsrc",local_61c,uVar16,aiPTI_Integer);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._M_dataplus._M_p != &local_618.field_2) {
          operator_delete(local_618._M_dataplus._M_p,
                          CONCAT71(local_618.field_2._M_allocated_capacity._1_7_,
                                   local_618.field_2._M_local_buf[0]) + 1);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != local_5f0);
    }
  }
  return;
}

Assistant:

void FBXConverter::TrySetTextureProperties(aiMaterial* out_mat, const LayeredTextureMap& layeredTextures,
            const std::string& propName,
            aiTextureType target, const MeshGeometry* const mesh) {
            LayeredTextureMap::const_iterator it = layeredTextures.find(propName);
            if (it == layeredTextures.end()) {
                return;
            }

            int texCount = (*it).second->textureCount();

            // Set the blend mode for layered textures
            int blendmode = (*it).second->GetBlendMode();
            out_mat->AddProperty(&blendmode, 1, _AI_MATKEY_TEXOP_BASE, target, 0);

            for (int texIndex = 0; texIndex < texCount; texIndex++) {

                const Texture* const tex = (*it).second->getTexture(texIndex);

                aiString path = GetTexturePath(tex);
                out_mat->AddProperty(&path, _AI_MATKEY_TEXTURE_BASE, target, texIndex);

                aiUVTransform uvTrafo;
                // XXX handle all kinds of UV transformations
                uvTrafo.mScaling = tex->UVScaling();
                uvTrafo.mTranslation = tex->UVTranslation();
                out_mat->AddProperty(&uvTrafo, 1, _AI_MATKEY_UVTRANSFORM_BASE, target, texIndex);

                const PropertyTable& props = tex->Props();

                int uvIndex = 0;

                bool ok;
                const std::string& uvSet = PropertyGet<std::string>(props, "UVSet", ok);
                if (ok) {
                    // "default" is the name which usually appears in the FbxFileTexture template
                    if (uvSet != "default" && uvSet.length()) {
                        // this is a bit awkward - we need to find a mesh that uses this
                        // material and scan its UV channels for the given UV name because
                        // assimp references UV channels by index, not by name.

                        // XXX: the case that UV channels may appear in different orders
                        // in meshes is unhandled. A possible solution would be to sort
                        // the UV channels alphabetically, but this would have the side
                        // effect that the primary (first) UV channel would sometimes
                        // be moved, causing trouble when users read only the first
                        // UV channel and ignore UV channel assignments altogether.

                        const unsigned int matIndex = static_cast<unsigned int>(std::distance(materials.begin(),
                            std::find(materials.begin(), materials.end(), out_mat)
                        ));

                        uvIndex = -1;
                        if (!mesh)
                        {
                            for (const MeshMap::value_type& v : meshes_converted) {
                                const MeshGeometry* const meshGeom = dynamic_cast<const MeshGeometry*> (v.first);
                                if (!meshGeom) {
                                    continue;
                                }

                                const MatIndexArray& mats = meshGeom->GetMaterialIndices();
                                if (std::find(mats.begin(), mats.end(), matIndex) == mats.end()) {
                                    continue;
                                }

                                int index = -1;
                                for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                    if (meshGeom->GetTextureCoords(i).empty()) {
                                        break;
                                    }
                                    const std::string& name = meshGeom->GetTextureCoordChannelName(i);
                                    if (name == uvSet) {
                                        index = static_cast<int>(i);
                                        break;
                                    }
                                }
                                if (index == -1) {
                                    FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                                    continue;
                                }

                                if (uvIndex == -1) {
                                    uvIndex = index;
                                }
                                else {
                                    FBXImporter::LogWarn("the UV channel named " + uvSet +
                                        " appears at different positions in meshes, results will be wrong");
                                }
                            }
                        }
                        else
                        {
                            int index = -1;
                            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                if (mesh->GetTextureCoords(i).empty()) {
                                    break;
                                }
                                const std::string& name = mesh->GetTextureCoordChannelName(i);
                                if (name == uvSet) {
                                    index = static_cast<int>(i);
                                    break;
                                }
                            }
                            if (index == -1) {
                                FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                            }

                            if (uvIndex == -1) {
                                uvIndex = index;
                            }
                        }

                        if (uvIndex == -1) {
                            FBXImporter::LogWarn("failed to resolve UV channel " + uvSet + ", using first UV channel");
                            uvIndex = 0;
                        }
                    }
                }

                out_mat->AddProperty(&uvIndex, 1, _AI_MATKEY_UVWSRC_BASE, target, texIndex);
            }
        }